

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

void getPossibleBiomesForLimits(char *ids,int mc,int (*limits) [2])

{
  int (*paiVar1) [2];
  long lVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int id;
  
  id = 0;
  memset(ids,0,0x100);
  do {
    if (id == 0x100) {
      return;
    }
    iVar3 = isOverworld(mc,id);
    if ((iVar3 != 0) && (piVar4 = getBiomeParaLimits(mc,id), piVar4 != (int *)0x0)) {
      lVar5 = 0;
      while (lVar5 != 6) {
        if ((piVar4[lVar5 * 2 + 1] < limits[lVar5][0]) ||
           (paiVar1 = limits + lVar5, lVar2 = lVar5 * 2, lVar5 = lVar5 + 1,
           (*paiVar1)[1] < piVar4[lVar2])) goto LAB_00110db5;
      }
      ids[piVar4[-1]] = '\x01';
    }
LAB_00110db5:
    id = id + 1;
  } while( true );
}

Assistant:

void getPossibleBiomesForLimits(char ids[256], int mc, int limits[6][2])
{
    int i, j;
    memset(ids, 0, 256*sizeof(char));

    for (i = 0; i < 256; i++)
    {
        if (!isOverworld(mc, i))
            continue;
        const int *bp = getBiomeParaLimits(mc, i);
        if (!bp)
            continue;

        for (j = 0; j < 6; j++)
        {
            if (limits[j][0] > bp[2*j+1] || limits[j][1] < bp[2*j+0])
                break;
        }
        if (j >= 6)
            ids[bp[-1]] = 1;
    }
}